

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Parser_Y.cpp
# Opt level: O0

parser_node * amrex::parser_newf2(parser_f2_t ftype,parser_node *l,parser_node *r)

{
  parser_node *ppVar1;
  parser_node *in_RDX;
  parser_node *in_RSI;
  int in_EDI;
  parser_f2 *tmp;
  
  ppVar1 = (parser_node *)malloc(0x20);
  ppVar1->type = PARSER_F2;
  ppVar1->l = in_RSI;
  ppVar1->r = in_RDX;
  (ppVar1->lvp).ip = in_EDI;
  return ppVar1;
}

Assistant:

struct parser_node*
parser_newf2 (enum parser_f2_t ftype, struct parser_node* l, struct parser_node* r)
{
    auto tmp = (struct parser_f2*) std::malloc(sizeof(struct parser_f2));
    tmp->type = PARSER_F2;
    tmp->l = l;
    tmp->r = r;
    tmp->ftype = ftype;
    return (struct parser_node*) tmp;
}